

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_BlindTransactionTest1_Test::
~ConfidentialTransaction_BlindTransactionTest1_Test
          (ConfidentialTransaction_BlindTransactionTest1_Test *this)

{
  ConfidentialTransaction_BlindTransactionTest1_Test *this_local;
  
  ~ConfidentialTransaction_BlindTransactionTest1_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTransaction, BlindTransactionTest1) {
  std::string tx_hex = "020000000001e6162f9bbac022e67327e717a3885b316a54e50c34ba266b58f1999854c596810000008000ffffffff0000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000001000000003b9aca00010000000005f5e10004017d63e62c547bcc63dcdd626493ca47219edb08de15e68dc12d773abcc6b4076e01000000003b9aca000017a914ba570779a432049e072b0f201e43f482c772a0808701e30071704b5fbe1cca1bdfb1760d46ec1d094b7057b4d45fad23f4bdd321debc010000000005f5e1000017a914bb1706309b3384d40a63619a353014018afd142b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000298100017a914a3949e9a8b0b813db67c8fc5ad14194a297979cd870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000";
  ConfidentialTransaction tx(tx_hex);
  double inputamount = 0.0018;
  std::string inputblinder =
      "0fb8bb7ffe429a536c41e5f7328499fdf8ee44394fa5f4a532eedd76caeeccb7";
  std::string inputasset =
      "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225";
  std::string inputassetblinder =
      "48b33c437a3eb3da46a14064c91bc431213fe03fe13d0774f5d84b4296617e48";
  std::string pubkey_issue1_hex =
      "029392a91eca1c4c31ef03f8297e8b1e339119f177d36e7fae547c8642791ab578";
  std::string privkey_issue1_hex =
      "5cf8bb2df2de6427475e6c1f1bea7a16dd6d6f6fab0ee20c8559aa90aa8e8a03";
  std::string pubkey_issue2_hex =
      "03c167b83234f6fb74ee40f9e3f22f723287fffc53aec9d71ab4e34c2070211061";
  std::string privkey_issue2_hex =
      "597c03264c9f0caf11119dc239825669a85c65ec926607a03e2140db78380c6b";
  std::string pubkey1_hex =
      "0213c4451645063e1edd5fe76e5194864c2246d4c4e6c8df5a305224046e1ea2c4";
  std::string privkey1_hex =
      "66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83";
  Pubkey pubkey1(pubkey1_hex);
  Privkey privkey1(privkey1_hex);
  Pubkey pubkeyIssue1(pubkey_issue1_hex);
  Privkey privkeyIssue1(privkey_issue1_hex);
  Pubkey pubkeyIssue2(pubkey_issue2_hex);
  Privkey privkeyIssue2(privkey_issue2_hex);
  Privkey issue_blind_key(
      "89ef3af787f3263d50fe81b6e1e5514a2c489b30614f5b29b29a846662196092");

  std::vector<BlindParameter> blind_list;
  std::vector<IssuanceBlindingKeyPair> issue_keys;
  BlindParameter param;
  IssuanceBlindingKeyPair issue_key;
  param.asset = ConfidentialAssetId(inputasset);
  param.abf = BlindFactor(inputassetblinder);
  param.vbf = BlindFactor(inputblinder);
  param.value = ConfidentialValue(Amount::CreateByCoinAmount(inputamount));
  blind_list.push_back(param);
  issue_key.asset_key = issue_blind_key;
  issue_key.token_key = issue_blind_key;
  issue_keys.push_back(issue_key);
  std::vector<Pubkey> pubkeys;
  pubkeys.push_back(pubkeyIssue1);
  pubkeys.push_back(pubkeyIssue2);
  pubkeys.push_back(pubkey1);
  pubkeys.push_back(Pubkey());
  std::vector<BlindData> blinder_list;

  EXPECT_NO_THROW((tx.BlindTransaction(
      blind_list, issue_keys, pubkeys, 1, 0,
      cfd::core::kDefaultBlindMinimumBits, &blinder_list)));
  // 乱数が混ざるため、サイズだけチェック
  EXPECT_EQ(tx.GetHex().length(), 43728);
  std::string blind_tx = tx.GetHex();
  // if(tx.GetHex().length() != 30918) {
  //   EXPECT_STREQ("", blind_tx.c_str());
  // }
  EXPECT_EQ(blinder_list.size(), 5);
  if (blinder_list.size() == 5) {
    EXPECT_EQ(blinder_list[0].value.GetAmount().GetSatoshiValue(), 1000000000);
    EXPECT_EQ(blinder_list[1].value.GetAmount().GetSatoshiValue(), 100000000);
    EXPECT_EQ(blinder_list[2].value.GetAmount().GetSatoshiValue(), 1000000000);
    EXPECT_EQ(blinder_list[3].value.GetAmount().GetSatoshiValue(), 100000000);
    EXPECT_EQ(blinder_list[4].value.GetAmount().GetSatoshiValue(), 170000);
    for (uint32_t index = 0; index < 5; ++index) {
      if (index == 0) {
        EXPECT_TRUE(blinder_list[index].is_issuance);
      } else {
        EXPECT_FALSE(blinder_list[index].is_issuance);
      }
    }
    for (uint32_t index = 0; index < 5; ++index) {
      if (index == 1) {
        EXPECT_TRUE(blinder_list[index].is_issuance_token);
      } else {
        EXPECT_FALSE(blinder_list[index].is_issuance_token);
      }
    }
    for (uint32_t index = 0; index < 5; ++index) {
      if ((index == 0) || (index == 1)) {
        EXPECT_TRUE(blinder_list[index].issuance_outpoint.IsValid());
        EXPECT_EQ(blinder_list[index].vout, 0);
      } else {
        EXPECT_FALSE(blinder_list[index].issuance_outpoint.IsValid());
        EXPECT_EQ(blinder_list[index].vout, index - 2);
      }
    }
  }

  std::vector<Privkey> blinding_keys;
  blinding_keys.push_back(privkeyIssue1);
  blinding_keys.push_back(privkeyIssue2);
  blinding_keys.push_back(privkey1);
  blinding_keys.push_back(Privkey());
  std::vector<UnblindParameter> unblindList;
  EXPECT_NO_THROW((unblindList = tx.UnblindTxOut(blinding_keys)));
  EXPECT_EQ(unblindList.size(), 3);
  if (unblindList.size() == 3) {
    EXPECT_EQ(unblindList[0].value.GetAmount().GetSatoshiValue(), 1000000000);
    EXPECT_EQ(unblindList[1].value.GetAmount().GetSatoshiValue(), 100000000);
    EXPECT_EQ(unblindList[2].value.GetAmount().GetSatoshiValue(), 170000);
  }

  std::vector<UnblindParameter> unblindIssueList;
  EXPECT_NO_THROW(
      (unblindIssueList = tx.UnblindTxIn(0, issue_blind_key, issue_blind_key)));
  EXPECT_EQ(unblindIssueList.size(), 2);
  if (unblindIssueList.size() == 2) {
    EXPECT_EQ(unblindIssueList[0].value.GetAmount().GetSatoshiValue(), 1000000000);
    EXPECT_EQ(unblindIssueList[1].value.GetAmount().GetSatoshiValue(), 100000000);
  }

  EXPECT_STREQ(tx.GetHex().c_str(), tx_hex.c_str());
}